

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.c
# Opt level: O3

ZyanStatus
ZyanVectorFindEx(ZyanVector *vector,void *element,ZyanISize *found_index,
                ZyanEqualityComparison comparison,ZyanUSize index,ZyanUSize count)

{
  ZyanBool ZVar1;
  ZyanStatus ZVar2;
  ZyanUSize i;
  
  if (vector == (ZyanVector *)0x0) {
    return 0x80100004;
  }
  if (vector->size == index || vector->size < count + index) {
    return 0x80100008;
  }
  ZVar2 = 0x100003;
  if (count != 0) {
    if (vector->element_size == 0) {
      __assert_fail("vector->element_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                    ,0x29f,
                    "ZyanStatus ZyanVectorFindEx(const ZyanVector *, const void *, ZyanISize *, ZyanEqualityComparison, ZyanUSize, ZyanUSize)"
                   );
    }
    if (vector->data == (void *)0x0) {
      __assert_fail("vector->data",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zyan-hook-engine/dependencies/zycore/src/Vector.c"
                    ,0x2a0,
                    "ZyanStatus ZyanVectorFindEx(const ZyanVector *, const void *, ZyanISize *, ZyanEqualityComparison, ZyanUSize, ZyanUSize)"
                   );
    }
    if (index < count + index) {
      do {
        ZVar1 = (*comparison)((void *)(vector->element_size * index + (long)vector->data),element);
        if (ZVar1 != '\0') {
          ZVar2 = 0x100002;
          goto LAB_0010d97f;
        }
        index = index + 1;
        count = count - 1;
      } while (count != 0);
      index = 0xffffffffffffffff;
      goto LAB_0010d97f;
    }
  }
  index = 0xffffffffffffffff;
LAB_0010d97f:
  *found_index = index;
  return ZVar2;
}

Assistant:

ZyanStatus ZyanVectorFindEx(const ZyanVector* vector, const void* element, ZyanISize* found_index,
    ZyanEqualityComparison comparison, ZyanUSize index, ZyanUSize count)
{
    if (!vector)
    {
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }
    if ((index + count > vector->size) || (index == vector->size))
    {
        return ZYAN_STATUS_OUT_OF_RANGE;
    }

    if (!count)
    {
        *found_index = -1;
        return ZYAN_STATUS_FALSE;
    }

    ZYAN_ASSERT(vector->element_size);
    ZYAN_ASSERT(vector->data);

    for (ZyanUSize i = index; i < index + count; ++i)
    {
        if (comparison(ZYCORE_VECTOR_OFFSET(vector, i), element))
        {
            *found_index = i;
            return ZYAN_STATUS_TRUE;
        }
    }

    *found_index = -1;
    return ZYAN_STATUS_FALSE;
}